

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

HighsLp * withoutSemiVariables
                    (HighsLp *__return_storage_ptr__,HighsLp *lp_,HighsSolution *solution,
                    double primal_feasibility_tolerance)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  vector<double,_std::allocator<double>_> *this;
  bool bVar2;
  uint uVar3;
  int iVar4;
  pointer piVar5;
  pointer pHVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *pvVar11;
  ostream *poVar12;
  HighsVarType HVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  size_type __new_size;
  int iVar20;
  double dVar21;
  double dVar22;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  int local_264;
  ulong local_260;
  vector<int,_std::allocator<int>_> *local_258;
  int local_24c;
  ulong local_248;
  HighsSolution *local_240;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *local_238;
  vector<double,_std::allocator<double>_> *local_230;
  vector<int,_std::allocator<int>_> *local_228;
  int local_21c;
  double local_218;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_210;
  pointer local_208;
  pointer local_200;
  vector<double,_std::allocator<double>_> *local_1f8;
  vector<double,_std::allocator<double>_> *local_1f0;
  vector<double,_std::allocator<double>_> *local_1e8;
  double local_1e0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1d8;
  pointer local_1d0;
  pointer local_1c8;
  vector<double,_std::allocator<double>_> *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_240 = solution;
  local_1e0 = primal_feasibility_tolerance;
  HighsLp::HighsLp(__return_storage_ptr__,lp_);
  uVar3 = __return_storage_ptr__->num_col_;
  local_260 = (ulong)(uint)__return_storage_ptr__->num_row_;
  local_238 = &__return_storage_ptr__->integrality_;
  uVar14 = 0;
  uVar15 = 0;
  if (0 < (int)uVar3) {
    uVar15 = (ulong)uVar3;
  }
  local_21c = 0;
  for (; uVar15 != uVar14; uVar14 = uVar14 + 1) {
    local_21c = local_21c +
                (uint)(((__return_storage_ptr__->integrality_).
                        super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar14] & ~kInteger) == kSemiContinuous);
  }
  local_258 = &(__return_storage_ptr__->a_matrix_).index_;
  local_248 = (ulong)local_21c;
  __new_size = (long)(__return_storage_ptr__->a_matrix_).start_.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[(int)uVar3] + local_248 * 2;
  std::vector<int,_std::allocator<int>_>::resize(local_258,__new_size);
  this = &(__return_storage_ptr__->a_matrix_).value_;
  std::vector<double,_std::allocator<double>_>::resize(this,__new_size);
  local_228 = &(__return_storage_ptr__->a_matrix_).start_;
  local_248 = local_248 * 2;
  piVar5 = (local_228->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pHVar6 = (local_238->super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar14 = (ulong)uVar3;
  while (0 < (int)uVar14) {
    lVar16 = (long)piVar5[uVar14];
    iVar19 = (int)__new_size;
    piVar5[uVar14] = iVar19;
    iVar20 = iVar19 + -2;
    if ((pHVar6[uVar14 - 1] & ~kInteger) != kSemiContinuous) {
      iVar20 = iVar19;
    }
    piVar7 = (local_258->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar18 = 0; (long)piVar5[uVar14 - 1] < lVar16 + lVar18; lVar18 = lVar18 + -1) {
      piVar7[(long)iVar20 + lVar18 + -1] = piVar7[lVar16 + lVar18 + -1];
      pdVar8[(long)iVar20 + lVar18 + -1] = pdVar8[lVar16 + lVar18 + -1];
    }
    __new_size = (size_type)(uint)(iVar20 + (int)lVar18);
    uVar14 = uVar14 - 1;
  }
  pHVar6 = (local_238->super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (local_228->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (local_258->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar14 = local_260;
  for (uVar17 = 0; uVar15 != uVar17; uVar17 = uVar17 + 1) {
    if ((pHVar6[uVar17] & ~kInteger) == kSemiContinuous) {
      lVar16 = (long)piVar5[uVar17 + 1];
      iVar20 = (int)uVar14;
      piVar7[lVar16 + -2] = iVar20;
      uVar14 = (ulong)(iVar20 + 2);
      piVar7[lVar16 + -1] = iVar20 + 1;
      pdVar9 = pdVar8 + lVar16 + -2;
      *pdVar9 = 1.0;
      pdVar9[1] = 1.0;
    }
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1c8 = (__return_storage_ptr__->col_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1d0 = (__return_storage_ptr__->col_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_200 = (__return_storage_ptr__->row_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_208 = (__return_storage_ptr__->row_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  bVar2 = local_240->value_valid;
  if (bVar2 == true) {
    pvVar1 = &local_240->row_value;
    uVar14 = local_248 & 0xffffffff;
    while (iVar20 = (int)uVar14, uVar14 = (ulong)(iVar20 - 1), iVar20 != 0) {
      local_288._M_dataplus._M_p = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (pvVar1,(double *)&local_288);
    }
  }
  local_1d8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              &__return_storage_ptr__->col_names_;
  local_210 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              &__return_storage_ptr__->row_names_;
  local_1c0 = &__return_storage_ptr__->col_cost_;
  local_230 = &__return_storage_ptr__->col_lower_;
  local_1f8 = &__return_storage_ptr__->col_upper_;
  local_1e8 = &__return_storage_ptr__->row_lower_;
  local_1f0 = &__return_storage_ptr__->row_upper_;
  pvVar1 = &local_240->col_value;
  uVar14 = 0;
  local_24c = 0;
  local_264 = 0;
  do {
    if (uVar14 == uVar15) {
      __return_storage_ptr__->num_col_ = __return_storage_ptr__->num_col_ + local_21c;
      __return_storage_ptr__->num_row_ = __return_storage_ptr__->num_row_ + (int)local_248;
      HighsLpMods::clear(&__return_storage_ptr__->mods_);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      return __return_storage_ptr__;
    }
    if (((local_238->super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>)._M_impl.
         super__Vector_impl_data._M_start[uVar14] & ~kInteger) == kSemiContinuous) {
      local_288._M_dataplus._M_p = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (local_1c0,(double *)&local_288);
      local_288._M_dataplus._M_p = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (local_230,(double *)&local_288);
      local_288._M_dataplus._M_p = (pointer)0x3ff0000000000000;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (local_1f8,(double *)&local_288);
      local_288._M_dataplus._M_p = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (local_1e8,(double *)&local_288);
      std::vector<double,_std::allocator<double>_>::push_back
                (local_1f0,(value_type_conflict1 *)&kHighsInf);
      if (local_1d0 != local_1c8) {
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        local_288._M_string_length = 0;
        local_288.field_2._M_local_buf[0] = '\0';
        std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
        std::__cxx11::string::~string((string *)&local_288);
        poVar12 = std::operator<<((ostream *)local_1a8,"semi_binary_");
        std::ostream::operator<<(poVar12,local_24c);
        std::__cxx11::stringbuf::str();
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_1d8,&local_288);
        local_24c = local_24c + 1;
        std::__cxx11::string::~string((string *)&local_288);
      }
      if (local_200 != local_208) {
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        local_288._M_string_length = 0;
        local_288.field_2._M_local_buf[0] = '\0';
        std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
        std::__cxx11::string::~string((string *)&local_288);
        poVar12 = std::operator<<((ostream *)local_1a8,"semi_lb_");
        std::ostream::operator<<(poVar12,local_264);
        std::__cxx11::stringbuf::str();
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_210,&local_288);
        std::__cxx11::string::~string((string *)&local_288);
      }
      local_288._M_dataplus._M_p._0_4_ = (int)local_260;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_258,(int *)&local_288);
      local_288._M_dataplus._M_p =
           (pointer)((ulong)(local_230->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                            .super__Vector_impl_data._M_start[uVar14] ^ 0x8000000000000000);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(this,(double *)&local_288);
      iVar20 = (int)local_260 + 1;
      if (bVar2 != false) {
        pdVar8 = (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_218 = pdVar8[uVar14];
        if (local_218 <= local_1e0) {
          pdVar8[uVar14] = 0.0;
          local_288._M_dataplus._M_p = (pointer)0x0;
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    (pvVar1,(double *)&local_288);
        }
        else {
          dVar22 = (local_230->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar14];
          dVar21 = local_218;
          if (local_218 <= dVar22) {
            dVar21 = dVar22;
          }
          pdVar8[uVar14] = dVar21;
          local_288._M_dataplus._M_p = (pointer)0x3ff0000000000000;
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    (pvVar1,(double *)&local_288);
        }
        pdVar8 = (local_240->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar9 = (local_240->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar22 = pdVar8[uVar14];
        dVar21 = dVar22 - local_218;
        if ((dVar21 != 0.0) || (NAN(dVar21))) {
          piVar5 = (local_228->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar19 = piVar5[uVar14 + 1];
          pdVar10 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          piVar7 = (local_258->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          for (lVar16 = (long)piVar5[uVar14]; lVar16 < iVar19; lVar16 = lVar16 + 1) {
            iVar4 = piVar7[lVar16];
            pdVar9[iVar4] = pdVar10[lVar16] * dVar21 + pdVar9[iVar4];
          }
          dVar22 = pdVar8[uVar14];
        }
        dVar21 = *(double *)
                  ((long)pdVar8 +
                  (((long)(__return_storage_ptr__->col_cost_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(__return_storage_ptr__->col_cost_).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) * 0x20000000 + -0x100000000 >> 0x1d));
        pdVar9[(int)local_260] =
             dVar22 - (__return_storage_ptr__->col_lower_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar14] * dVar21;
        pdVar9[iVar20] =
             pdVar8[uVar14] -
             dVar21 * (__return_storage_ptr__->col_upper_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar14];
      }
      local_288._M_dataplus._M_p = &DAT_fff0000000000000;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (local_1e8,(double *)&local_288);
      local_288._M_dataplus._M_p = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (local_1f0,(double *)&local_288);
      if (local_200 != local_208) {
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        local_288._M_string_length = 0;
        local_288.field_2._M_local_buf[0] = '\0';
        std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
        std::__cxx11::string::~string((string *)&local_288);
        poVar12 = std::operator<<((ostream *)local_1a8,"semi_ub_");
        std::ostream::operator<<(poVar12,local_264);
        std::__cxx11::stringbuf::str();
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_210,&local_288);
        local_264 = local_264 + 1;
        std::__cxx11::string::~string((string *)&local_288);
      }
      local_288._M_dataplus._M_p._0_4_ = iVar20;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_258,(int *)&local_288);
      local_288._M_dataplus._M_p =
           (pointer)((ulong)(local_1f8->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                            .super__Vector_impl_data._M_start[uVar14] ^ 0x8000000000000000);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(this,(double *)&local_288);
      local_288._M_dataplus._M_p._0_4_ =
           (int)((ulong)((long)(__return_storage_ptr__->a_matrix_).index_.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(__return_storage_ptr__->a_matrix_).index_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_228,(int *)&local_288);
      pvVar11 = local_238;
      local_288._M_dataplus._M_p._0_1_ = 1;
      std::vector<HighsVarType,_std::allocator<HighsVarType>_>::emplace_back<HighsVarType>
                (local_238,(HighsVarType *)&local_288);
      pHVar6 = (pvVar11->super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>)._M_impl.
               super__Vector_impl_data._M_start;
      HVar13 = pHVar6[uVar14];
      if (HVar13 == kSemiContinuous) {
        HVar13 = kContinuous;
LAB_00262801:
        pHVar6[uVar14] = HVar13;
      }
      else if (HVar13 == kSemiInteger) {
        HVar13 = kInteger;
        goto LAB_00262801;
      }
      local_260 = (ulong)((int)local_260 + 2);
      (local_230->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar14] = 0.0;
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

HighsLp withoutSemiVariables(const HighsLp& lp_, HighsSolution& solution,
                             const double primal_feasibility_tolerance) {
  HighsLp lp = lp_;
  HighsInt num_col = lp.num_col_;
  HighsInt num_row = lp.num_row_;
  HighsInt num_semi_variables = 0;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
        lp.integrality_[iCol] == HighsVarType::kSemiInteger)
      num_semi_variables++;
  }
  assert(num_semi_variables);
  // Insert spaces for index/value of new coefficients for
  // semi-variables
  vector<HighsInt>& start = lp.a_matrix_.start_;
  vector<HighsInt>& index = lp.a_matrix_.index_;
  vector<double>& value = lp.a_matrix_.value_;
  HighsInt num_nz = start[num_col];
  HighsInt new_num_nz = num_nz + 2 * num_semi_variables;
  HighsInt new_el = new_num_nz;
  index.resize(new_num_nz);
  value.resize(new_num_nz);
  for (HighsInt iCol = num_col - 1; iCol >= 0; iCol--) {
    HighsInt from_el = start[iCol + 1] - 1;
    start[iCol + 1] = new_el;
    if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
        lp.integrality_[iCol] == HighsVarType::kSemiInteger)
      new_el -= 2;
    for (HighsInt iEl = from_el; iEl >= start[iCol]; iEl--) {
      new_el--;
      index[new_el] = index[iEl];
      value[new_el] = value[iEl];
    }
  }
  assert(new_el == 0);
  // Insert the new coefficients for semi-variables
  HighsInt row_num = num_row;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
        lp.integrality_[iCol] == HighsVarType::kSemiInteger) {
      HighsInt iEl = start[iCol + 1] - 2;
      index[iEl] = row_num++;
      value[iEl] = 1;
      iEl++;
      index[iEl] = row_num++;
      value[iEl] = 1;
    }
  }
  num_nz = start[num_col];
  new_num_nz = num_nz + 2 * num_semi_variables;
  row_num = num_row;
  HighsInt semi_col_num = 0;
  HighsInt semi_row_num = 0;
  // Insert the new variables and their coefficients
  std::stringstream ss;
  const bool has_col_names = (lp.col_names_.size() != 0);
  const bool has_row_names = (lp.row_names_.size() != 0);
  const bool has_solution = solution.value_valid;
  if (has_solution) {
    // Create zeroed row values for the new rows
    assert((HighsInt)solution.row_value.size() == lp_.num_row_);
    for (HighsInt iCol = 0; iCol < 2 * num_semi_variables; iCol++)
      solution.row_value.push_back(0);
    assert((HighsInt)solution.col_value.size() == lp_.num_col_);
    assert((HighsInt)solution.row_value.size() ==
           lp_.num_row_ + 2 * num_semi_variables);
  }
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
        lp.integrality_[iCol] == HighsVarType::kSemiInteger) {
      // Add a binary variable with zero cost
      lp.col_cost_.push_back(0);
      lp.col_lower_.push_back(0);
      lp.col_upper_.push_back(1);
      // Complete x - l*y >= 0
      lp.row_lower_.push_back(0);
      lp.row_upper_.push_back(kHighsInf);
      if (has_col_names) {
        // Create a column name
        ss.str(std::string());
        ss << "semi_binary_" << semi_col_num++;
        lp.col_names_.push_back(ss.str());
      }
      if (has_row_names) {
        // Create a row name
        ss.str(std::string());
        ss << "semi_lb_" << semi_row_num;
        lp.row_names_.push_back(ss.str());
      }
      index.push_back(row_num++);
      value.push_back(-lp.col_lower_[iCol]);
      // Accommodate any primal solution
      if (has_solution) {
        // Record the previous solution value so any change can be
        // determined
        const double prev_primal = solution.col_value[iCol];
        if (solution.col_value[iCol] <= primal_feasibility_tolerance) {
          // Currently at or below zero, so binary is 0
          solution.col_value[iCol] = 0;
          solution.col_value.push_back(0);
        } else {
          // Otherwise, solution is at least lower bound, and binary
          // is 1
          solution.col_value[iCol] =
              std::max(lp.col_lower_[iCol], solution.col_value[iCol]);
          solution.col_value.push_back(1);
        }
        const double dl_primal = solution.col_value[iCol] - prev_primal;
        if (dl_primal) {
          // Change in primal value, so update row values. NB start
          // has been extended to incorporate the values in this
          // column for the new rows. Their solution values are zero,
          // but will be set later
          for (HighsInt iEl = start[iCol]; iEl < start[iCol + 1]; iEl++)
            solution.row_value[index[iEl]] += dl_primal * value[iEl];
        }
        const HighsInt new_col = lp.col_cost_.size() - 1;
        const double binary_value = solution.col_value[new_col];
        solution.row_value[row_num - 1] =
            solution.col_value[iCol] - lp.col_lower_[iCol] * binary_value;
        solution.row_value[row_num] =
            solution.col_value[iCol] - lp.col_upper_[iCol] * binary_value;
      }
      // Complete x - u*y <= 0
      lp.row_lower_.push_back(-kHighsInf);
      lp.row_upper_.push_back(0);
      if (has_row_names) {
        // Create a row name
        ss.str(std::string());
        ss << "semi_ub_" << semi_row_num++;
        lp.row_names_.push_back(ss.str());
      }
      index.push_back(row_num++);
      value.push_back(-lp.col_upper_[iCol]);
      // Add the next start
      start.push_back(index.size());
      lp.integrality_.push_back(HighsVarType::kInteger);
      if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous) {
        lp.integrality_[iCol] = HighsVarType::kContinuous;
      } else if (lp.integrality_[iCol] == HighsVarType::kSemiInteger) {
        lp.integrality_[iCol] = HighsVarType::kInteger;
      }
      // Change the lower bound on the semi-variable to zero. Cannot
      // do this earlier, as its original value is used in constraint
      // 0 <= x-l*y
      lp.col_lower_[iCol] = 0;
    }
  }
  num_col += num_semi_variables;
  lp.num_col_ += num_semi_variables;
  lp.num_row_ += 2 * num_semi_variables;
  assert((HighsInt)index.size() == new_num_nz);
  // Clear any modifications inherited from lp_
  lp.mods_.clear();
  return lp;
}